

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O2

DmvVecPtrMap * __thiscall
adios2::format::DataManSerializer::GetFullMetadataMap
          (DmvVecPtrMap *__return_storage_ptr__,DataManSerializer *this)

{
  int iVar1;
  undefined8 uVar2;
  ScopedTimer __var2406;
  ScopedTimer local_20;
  
  if (GetFullMetadataMap()::__var406 == '\0') {
    iVar1 = __cxa_guard_acquire(&GetFullMetadataMap()::__var406);
    if (iVar1 != 0) {
      uVar2 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                  ,
                                  "DmvVecPtrMap adios2::format::DataManSerializer::GetFullMetadataMap()"
                                  ,0x196);
      GetFullMetadataMap::__var406 = (void *)ps_timer_create_(uVar2);
      __cxa_guard_release(&GetFullMetadataMap()::__var406);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_20,GetFullMetadataMap::__var406);
  std::mutex::lock(&this->m_DataManVarMapMutex);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&(this->m_DataManVarMap)._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_DataManVarMapMutex);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_20);
  return __return_storage_ptr__;
}

Assistant:

DmvVecPtrMap DataManSerializer::GetFullMetadataMap()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
    return m_DataManVarMap;
}